

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::DivideBoundarySkeletonElements(TPZMHMeshControl *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  int iVar3;
  TPZGeoEl *pTVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  int64_t iVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  _Base_ptr p_Var11;
  _Self __tmp;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  mapdivided;
  TPZManVector<TPZGeoEl_*,_10> subels;
  long local_f8;
  TPZManVector<long,_10> *local_f0;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *local_e8;
  _Rb_tree_node_base *local_e0;
  _Base_ptr local_d8;
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  local_d0;
  TPZManVector<TPZGeoEl_*,_10> local_a0;
  
  local_e8 = &this->fInterfaces;
  local_e0 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f0 = &this->fGeoToMHMDomain;
  do {
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar9 = false;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var6 = (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var6 != local_e0; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      p_Var11 = *(_Base_ptr *)(p_Var6 + 1);
      pTVar4 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,(int64_t)p_Var11);
      iVar3 = (**(code **)(*(long *)pTVar4 + 0x1d0))(pTVar4);
      if (iVar3 == 0) {
        pmVar5 = std::
                 map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                 ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                               *)&local_d0,(key_type_conflict1 *)(p_Var6 + 1));
        p_Var11 = p_Var6[1]._M_left;
        pmVar5->first = (long)p_Var6[1]._M_parent;
        pmVar5->second = (long)p_Var11;
      }
      else {
        TPZManVector<TPZGeoEl_*,_10>::TPZManVector(&local_a0,0);
        (**(code **)(*(long *)pTVar4 + 0x1c0))(pTVar4,&local_a0);
        iVar7 = local_a0.super_TPZVec<TPZGeoEl_*>.fNElements;
        if (local_a0.super_TPZVec<TPZGeoEl_*>.fNElements < 1) {
          iVar7 = 0;
        }
        local_d8 = p_Var11;
        for (lVar10 = 0; iVar7 != lVar10; lVar10 = lVar10 + 1) {
          pTVar4 = local_a0.super_TPZVec<TPZGeoEl_*>.fStore[lVar10];
          lVar8 = pTVar4->fIndex;
          if ((this->fGeoToMHMDomain).super_TPZVec<long>.fNElements <= lVar8) {
            local_f8 = -1;
            TPZManVector<long,_10>::Resize(local_f0,lVar8 + 1000,&local_f8);
            pTVar4 = local_a0.super_TPZVec<TPZGeoEl_*>.fStore[lVar10];
            lVar8 = pTVar4->fIndex;
          }
          plVar1 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
          plVar1[lVar8] = plVar1[(long)p_Var11];
          local_f8 = pTVar4->fIndex;
          pmVar5 = std::
                   map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                 *)&local_d0,&local_f8);
          pmVar5->first = (long)p_Var6[1]._M_parent;
          p_Var2 = p_Var6[1]._M_left;
          pmVar5->second = (long)p_Var2;
          if (p_Var11 == p_Var2) {
            lVar8 = local_a0.super_TPZVec<TPZGeoEl_*>.fStore[lVar10]->fIndex;
            local_f8 = lVar8;
            pmVar5 = std::
                     map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                     ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                   *)&local_d0,&local_f8);
            pmVar5->second = lVar8;
            p_Var11 = local_d8;
          }
        }
        TPZManVector<TPZGeoEl_*,_10>::~TPZManVector(&local_a0);
        bVar9 = true;
      }
    }
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::operator=(&local_e8->_M_t,&local_d0);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::~_Rb_tree(&local_d0);
  } while (bVar9);
  local_a0.super_TPZVec<TPZGeoEl_*>._vptr_TPZVec = (_func_int **)0xffffffffffffffff;
  TPZManVector<long,_10>::Resize
            (local_f0,(((this->fGMesh).fRef)->fPointer->fElementVec).
                      super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,(long *)&local_a0);
  return;
}

Assistant:

void TPZMHMeshControl::DivideBoundarySkeletonElements()
{
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    bool hasdivided = true;
    while (hasdivided)
    {
        hasdivided = false;
        // mapdivided will contain the new fInterface structure
        std::map<int64_t, std::pair<int64_t,int64_t> > mapdivided;
        for (it=fInterfaces.begin(); it!=fInterfaces.end(); it++) {
            int64_t elindex = it->first;
            // if the following condition is not satisfied then the interface is not a boundary
//            if (elindex != it->second.second) {
//                mapdivided[it->first] = it->second;
//                continue;
//            }
            TPZGeoEl *gel = fGMesh->Element(elindex);
            // if the geometric element associated with the interface was not divided
            // then the interface will not be divided either
            if(!gel->HasSubElement())
            {
                mapdivided[it->first] = it->second;
                continue;
            }
            hasdivided = true;
            TPZManVector<TPZGeoEl *,10> subels;
            gel->Divide(subels);
            int64_t nsub = subels.size();
            for (int is=0; is<nsub; is++) {
                if (subels[is]->Index() >= fGeoToMHMDomain.size()) {
                    fGeoToMHMDomain.Resize(subels[is]->Index()+1000, -1);
                }
                fGeoToMHMDomain[subels[is]->Index()] = fGeoToMHMDomain[elindex];
                mapdivided[subels[is]->Index()] = it->second;
                // for boundary elements, the second element is the interface element
                // update the interface data structure
                if(elindex == it->second.second)
                {
                    mapdivided[subels[is]->Index()].second = subels[is]->Index();
                }
            }
        }
        fInterfaces = mapdivided;
    }
//    BuildWrapMesh(fGMesh->Dimension());
//    BuildWrapMesh(fGMesh->Dimension()-1);
    fGeoToMHMDomain.Resize(fGMesh->NElements(), -1);
}